

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

void __thiscall FixedBuffer<4000000>::append(FixedBuffer<4000000> *this,char *buf,size_t len)

{
  int iVar1;
  size_t in_RDX;
  void *in_RSI;
  FixedBuffer<4000000> *in_RDI;
  
  iVar1 = avail(in_RDI);
  if ((int)in_RDX < iVar1) {
    memcpy(in_RDI->cur_,in_RSI,in_RDX);
    in_RDI->cur_ = in_RDI->cur_ + in_RDX;
  }
  return;
}

Assistant:

void append(const char* buf, size_t len){
        if(avail() > static_cast<int>(len)){
            memcpy(cur_, buf, len);
            cur_+=len;
        }
    }